

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O1

optional<PSEngine::TurnHistory> * __thiscall
PSEngine::next_turn(optional<PSEngine::TurnHistory> *__return_storage_ptr__,PSEngine *this)

{
  TurnHistory *__x;
  int iVar1;
  WinCondition *pWVar2;
  bool bVar3;
  bool bVar4;
  pointer pCVar5;
  bool bVar6;
  WinCondition *win_condition;
  pointer pCVar7;
  WinCondition *p_win_condition;
  bool bVar8;
  vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_> subturn_commands;
  TurnHistory last_turn_history_save;
  Level last_turn_save;
  vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_> local_c8;
  Level *local_b0;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *local_a8;
  vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_> local_a0;
  bool local_88;
  value_type local_80;
  vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_> local_58;
  undefined8 uStack_40;
  
  local_80.size.y = (this->m_current_level).size.y;
  local_80.level_idx = (this->m_current_level).level_idx;
  local_80.size.x = (this->m_current_level).size.x;
  local_a8 = &(this->m_current_level).cells;
  std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::vector(&local_80.cells,local_a8);
  __x = &this->m_turn_history;
  std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::vector
            (&local_a0,&__x->subturns);
  local_b0 = &this->m_current_level;
  local_88 = (this->m_turn_history).was_turn_cancelled;
  uStack_40 = 0;
  local_c8.super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)(this->m_turn_history).subturns.
                super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_c8.super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (pointer)(this->m_turn_history).subturns.
                super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_c8.super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (pointer)(this->m_turn_history).subturns.
                super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_turn_history).subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_turn_history).subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_turn_history).subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::~vector
            ((vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_> *)
             &local_c8);
  (this->m_turn_history).was_turn_cancelled = uStack_40._0_1_;
  std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::~vector
            (&local_58);
  bVar4 = false;
  do {
    next_subturn(this);
    SubturnHistory::gather_all_subturn_commands
              (&local_c8,
               (this->m_turn_history).subturns.
               super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    pCVar5 = local_c8.
             super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar8 = local_c8.
            super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_c8.
            super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    if (bVar8) {
      bVar6 = false;
    }
    else {
      bVar6 = false;
      pCVar7 = local_c8.
               super__Vector_base<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        iVar1 = *(int *)&(((vector<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_> *)
                          &pCVar7->type)->
                         super__Vector_base<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>
                         )._M_impl.super__Vector_impl_data._M_start;
        bVar3 = true;
        if (iVar1 == 1) {
          bVar6 = false;
          bVar4 = true;
        }
        else if (iVar1 == 3) {
          if (!bVar4) {
            bVar6 = true;
          }
        }
        else if (iVar1 == 2) {
          (local_b0->size).y = local_80.size.y;
          local_b0->level_idx = local_80.level_idx;
          (local_b0->size).x = local_80.size.x;
          std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::operator=
                    (local_a8,&local_80.cells);
          std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::vector
                    (&local_58,&__x->subturns);
          uStack_40 = CONCAT71(uStack_40._1_7_,1);
          std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::
          operator=(&__x->subturns,&local_a0);
          (this->m_turn_history).was_turn_cancelled = local_88;
          std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::vector
                    ((vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_> *)
                     __return_storage_ptr__,&local_58);
          (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>).
          _M_payload.super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
          super__Optional_payload_base<PSEngine::TurnHistory>._M_payload._M_value.was_turn_cancelled
               = uStack_40._0_1_;
          (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>).
          _M_payload.super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
          super__Optional_payload_base<PSEngine::TurnHistory>._M_engaged = true;
          std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::~vector
                    (&local_58);
          bVar3 = false;
        }
        if (!bVar3) break;
        pCVar7 = pCVar7 + 1;
        bVar8 = pCVar7 == pCVar5;
      } while (!bVar8);
    }
    std::vector<CompiledGame::Command,_std::allocator<CompiledGame::Command>_>::~vector(&local_c8);
    if (!bVar8) goto LAB_001108b9;
  } while (bVar6);
  if ((this->m_turn_history).subturns.
      super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_turn_history).subturns.
      super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::vector<PSEngine::Level,_std::allocator<PSEngine::Level>_>::push_back
              (&this->m_level_state_stack,&local_80);
    print_subturns_history(this);
  }
  p_win_condition =
       (this->m_compiled_game).win_conditions.
       super__Vector_base<CompiledGame::WinCondition,_std::allocator<CompiledGame::WinCondition>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pWVar2 = (this->m_compiled_game).win_conditions.
           super__Vector_base<CompiledGame::WinCondition,_std::allocator<CompiledGame::WinCondition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while ((bVar8 = p_win_condition == pWVar2, !bVar8 &&
         (bVar6 = check_win_condition(this,p_win_condition), bVar6))) {
    p_win_condition = p_win_condition + 1;
  }
  if ((bVar8) || (bVar4)) {
    this->m_is_level_won = true;
  }
  std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::vector
            ((vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_> *)
             __return_storage_ptr__,&__x->subturns);
  (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>)._M_payload.
  super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
  super__Optional_payload_base<PSEngine::TurnHistory>._M_payload._M_value.was_turn_cancelled =
       (this->m_turn_history).was_turn_cancelled;
  (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>)._M_payload.
  super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
  super__Optional_payload_base<PSEngine::TurnHistory>._M_engaged = true;
LAB_001108b9:
  std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::~vector
            (&local_a0);
  std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector(&local_80.cells);
  return __return_storage_ptr__;
}

Assistant:

optional<PSEngine::TurnHistory> PSEngine::next_turn()
{
    Level last_turn_save = m_current_level;
    TurnHistory last_turn_history_save = m_turn_history;

    m_turn_history = TurnHistory();

    bool win_requested_by_command = false;
    bool keep_computing_subturn = false;
    do
    {
        keep_computing_subturn = false;

        if(next_subturn())
        {
            vector<CompiledGame::Command> subturn_commands = m_turn_history.subturns.back().gather_all_subturn_commands();

            for(const auto& command : subturn_commands)
            {
                if(command.type == CompiledGame::CommandType::Win)
                {
                    win_requested_by_command = true;
                    keep_computing_subturn = false;
                }
                else if (command.type == CompiledGame::CommandType::Cancel)
                {
                    m_current_level = last_turn_save;
                    TurnHistory cancelled_turn_history = m_turn_history;
                    cancelled_turn_history.was_turn_cancelled = true;
                    m_turn_history = last_turn_history_save;
                    return optional<PSEngine::TurnHistory>(cancelled_turn_history);
                }
                else if (command.type == CompiledGame::CommandType::Again)
                {
                    if(!win_requested_by_command)
                    {
                        keep_computing_subturn = true;
                    }
                }

            }
        }

    } while (keep_computing_subturn); //todo add an infinite loop safety

    if( m_turn_history.subturns.size() > 0)
    {
        m_level_state_stack.push_back(last_turn_save);
        print_subturns_history();
    }
    //else it means nothing happened

    if(check_win_conditions() || win_requested_by_command)
    {
        m_is_level_won = true;
    }

    return optional<PSEngine::TurnHistory>(m_turn_history);
}